

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_or_8_er_pi7(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint res;
  
  uVar1 = OPER_A7_PI_8();
  uVar3 = m68ki_cpu.ir >> 9 & 7;
  uVar2 = uVar1 | m68ki_cpu.dar[uVar3];
  m68ki_cpu.dar[uVar3] = uVar2;
  m68ki_cpu.n_flag = uVar2 & 0xff;
  m68ki_cpu.not_z_flag = m68ki_cpu.n_flag;
  m68ki_cpu.c_flag = 0;
  m68ki_cpu.v_flag = 0;
  return;
}

Assistant:

static void m68k_op_or_8_er_pi7(void)
{
	uint res = MASK_OUT_ABOVE_8((DX |= OPER_A7_PI_8()));

	FLAG_N = NFLAG_8(res);
	FLAG_Z = res;
	FLAG_C = CFLAG_CLEAR;
	FLAG_V = VFLAG_CLEAR;
}